

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData *
GeneratePrehistorikTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  int gap3_bytes;
  bool bVar2;
  int iVar3;
  Data *data;
  BitBuffer *bitstream;
  pointer this;
  BitstreamTrackBuilder bitbuf;
  
  bVar2 = IsPrehistorikTrack(track);
  if (!bVar2) {
    __assert_fail("IsPrehistorikTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x2e6,"TrackData GeneratePrehistorikTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
  TrackBuilder::addTrackStart(&bitbuf.super_TrackBuilder,false);
  iVar3 = Track::size(track);
  gap3_bytes = 0x1e;
  if (iVar3 == 0xb) {
    gap3_bytes = 0x6a;
  }
  this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
         super__Vector_impl_data._M_start;
  pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this == pSVar1) {
LAB_00175829:
      bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
      TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
      BitBuffer::~BitBuffer(&bitbuf.m_buffer);
      return __return_storage_ptr__;
    }
    if ((this->header).sector == 0xc) {
      data = Sector::data_copy(this,0);
      TrackBuilder::addSector
                (&bitbuf.super_TrackBuilder,&this->header,data,gap3_bytes,this->dam,true);
      goto LAB_00175829;
    }
    TrackBuilder::addSector(&bitbuf.super_TrackBuilder,this,gap3_bytes);
    this = this + 1;
  } while( true );
}

Assistant:

TrackData GeneratePrehistorikTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsPrehistorikTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    auto gap3 = (track.size() == 11) ? 106 : 30;
    for (auto& sector : track)
    {
        if (sector.header.sector != 12)
            bitbuf.addSector(sector, gap3);
        else
        {
            bitbuf.addSector(sector.header, sector.data_copy(), gap3, sector.dam, true);
            break;
        }
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}